

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O3

CURLcode cr_lc_read(Curl_easy *data,Curl_creader *reader,char *buf,size_t blen,size_t *pnread,
                   _Bool *peos)

{
  bufq *q;
  void *pvVar1;
  Curl_creader *pCVar2;
  curl_trc_feat *pcVar3;
  _Bool _Var4;
  CURLcode CVar5;
  void *pvVar6;
  byte bVar7;
  ulong uVar8;
  ulong uVar9;
  _Bool *p_Var10;
  size_t sVar11;
  _Bool eos;
  size_t nread;
  size_t n;
  _Bool local_69;
  size_t *local_68;
  size_t local_60;
  _Bool *local_58;
  size_t local_50;
  Curl_easy *local_48;
  char *local_40;
  size_t local_38;
  
  pvVar1 = reader->ctx;
  if ((*(byte *)((long)pvVar1 + 0x60) & 2) != 0) {
    *pnread = 0;
    *peos = true;
    return CURLE_OK;
  }
  q = (bufq *)((long)pvVar1 + 0x20);
  local_68 = pnread;
  local_60 = blen;
  local_58 = peos;
  local_48 = data;
  _Var4 = Curl_bufq_is_empty(q);
  if (_Var4) {
    if ((*(byte *)((long)pvVar1 + 0x60) & 1) != 0) {
      *(byte *)((long)pvVar1 + 0x60) = *(byte *)((long)pvVar1 + 0x60) | 2;
      *local_68 = 0;
      *local_58 = true;
      return CURLE_OK;
    }
    pCVar2 = reader->next;
    local_50 = 0;
    local_69 = false;
    if (pCVar2 == (Curl_creader *)0x0) {
      return CURLE_READ_ERROR;
    }
    CVar5 = (*pCVar2->crt->do_read)(local_48,pCVar2,buf,local_60,&local_50,&local_69);
    sVar11 = local_50;
    _Var4 = local_69;
    if (CVar5 != CURLE_OK) {
      return CVar5;
    }
    bVar7 = *(byte *)((long)pvVar1 + 0x60) & 0xfe | local_69;
    *(byte *)((long)pvVar1 + 0x60) = bVar7;
    if ((local_50 != 0) && (pvVar6 = memchr(buf,10,local_50), pvVar6 != (void *)0x0)) {
      uVar9 = 0;
      uVar8 = 0;
      local_40 = buf;
      do {
        if ((buf[uVar8] == '\n') && ((*(byte *)((long)pvVar1 + 0x60) & 4) == 0)) {
          CVar5 = Curl_bufq_cwrite(q,buf + uVar9,uVar8 - uVar9,&local_38);
          if (CVar5 != CURLE_OK) {
            return CVar5;
          }
          CVar5 = Curl_bufq_cwrite(q,"\r\n",2,&local_38);
          if (CVar5 != CURLE_OK) {
            return CVar5;
          }
          uVar9 = uVar8 + 1;
          buf = local_40;
          sVar11 = local_50;
        }
        else {
          *(byte *)((long)pvVar1 + 0x60) =
               *(byte *)((long)pvVar1 + 0x60) & 0xfb | (buf[uVar8] == '\r') << 2;
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < sVar11);
      if ((uVar9 <= uVar8 && uVar8 - uVar9 != 0) &&
         (CVar5 = Curl_bufq_cwrite(q,buf + uVar9,uVar8 - uVar9,&local_38), CVar5 != CURLE_OK)) {
        return CVar5;
      }
      goto LAB_00151714;
    }
    if (_Var4 != false) {
      *(byte *)((long)pvVar1 + 0x60) = bVar7 | 2;
    }
    *local_68 = sVar11;
    _Var4 = (_Bool)(*(byte *)((long)pvVar1 + 0x60) >> 1 & 1);
    p_Var10 = local_58;
  }
  else {
LAB_00151714:
    p_Var10 = local_58;
    *local_58 = false;
    CVar5 = Curl_bufq_cread(q,buf,local_60,local_68);
    uVar9 = (ulong)CVar5;
    if (((CVar5 != CURLE_OK) || (uVar9 = 0, (*(byte *)((long)pvVar1 + 0x60) & 1) == 0)) ||
       (_Var4 = Curl_bufq_is_empty(q), !_Var4)) goto LAB_0015177f;
    *(byte *)((long)pvVar1 + 0x60) = *(byte *)((long)pvVar1 + 0x60) | 2;
    _Var4 = true;
  }
  *p_Var10 = _Var4;
  uVar9 = 0;
LAB_0015177f:
  if ((((local_48 != (Curl_easy *)0x0) && (((local_48->set).field_0x897 & 0x40) != 0)) &&
      ((pcVar3 = (local_48->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level)))
      ) && (0 < Curl_trc_feat_read.log_level)) {
    Curl_trc_read(local_48,"cr_lc_read(len=%zu) -> %d, nread=%zu, eos=%d",local_60,uVar9,*local_68,
                  (ulong)*p_Var10);
  }
  return (CURLcode)uVar9;
}

Assistant:

static CURLcode cr_lc_read(struct Curl_easy *data,
                           struct Curl_creader *reader,
                           char *buf, size_t blen,
                           size_t *pnread, bool *peos)
{
  struct cr_lc_ctx *ctx = reader->ctx;
  CURLcode result;
  size_t nread, i, start, n;
  bool eos;

  if(ctx->eos) {
    *pnread = 0;
    *peos = TRUE;
    return CURLE_OK;
  }

  if(Curl_bufq_is_empty(&ctx->buf)) {
    if(ctx->read_eos) {
      ctx->eos = TRUE;
      *pnread = 0;
      *peos = TRUE;
      return CURLE_OK;
    }
    /* Still getting data form the next reader, ctx->buf is empty */
    result = Curl_creader_read(data, reader->next, buf, blen, &nread, &eos);
    if(result)
      return result;
    ctx->read_eos = eos;

    if(!nread || !memchr(buf, '\n', nread)) {
      /* nothing to convert, return this right away */
      if(ctx->read_eos)
        ctx->eos = TRUE;
      *pnread = nread;
      *peos = ctx->eos;
      goto out;
    }

    /* at least one \n might need conversion to '\r\n', place into ctx->buf */
    for(i = start = 0; i < nread; ++i) {
      /* if this byte is not an LF character, or if the preceding character is
         a CR (meaning this already is a CRLF pair), go to next */
      if((buf[i] != '\n') || ctx->prev_cr) {
        ctx->prev_cr = (buf[i] == '\r');
        continue;
      }
      ctx->prev_cr = FALSE;
      /* on a soft limit bufq, we do not need to check length */
      result = Curl_bufq_cwrite(&ctx->buf, buf + start, i - start, &n);
      if(!result)
        result = Curl_bufq_cwrite(&ctx->buf, STRCONST("\r\n"), &n);
      if(result)
        return result;
      start = i + 1;
    }

    if(start < i) { /* leftover */
      result = Curl_bufq_cwrite(&ctx->buf, buf + start, i - start, &n);
      if(result)
        return result;
    }
  }

  DEBUGASSERT(!Curl_bufq_is_empty(&ctx->buf));
  *peos = FALSE;
  result = Curl_bufq_cread(&ctx->buf, buf, blen, pnread);
  if(!result && ctx->read_eos && Curl_bufq_is_empty(&ctx->buf)) {
    /* no more data, read all, done. */
    ctx->eos = TRUE;
    *peos = TRUE;
  }

out:
  CURL_TRC_READ(data, "cr_lc_read(len=%zu) -> %d, nread=%zu, eos=%d",
                blen, result, *pnread, *peos);
  return result;
}